

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatatypeValidator.cpp
# Opt level: O1

void __thiscall xercesc_4_0::DatatypeValidator::setTypeName(DatatypeValidator *this,XMLCh *typeName)

{
  short *psVar1;
  XMLCh *pXVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  size_t __n;
  
  if (this->fTypeName != (XMLCh *)0x0) {
    (*this->fMemoryManager->_vptr_MemoryManager[4])();
    this->fTypeName = (XMLCh *)0x0;
  }
  if (typeName == (XMLCh *)0x0) {
    this->fTypeLocalName = L"";
    this->fTypeUri = L"";
  }
  else {
    __n = 0;
    do {
      psVar1 = (short *)((long)typeName + __n);
      __n = __n + 2;
    } while (*psVar1 != 0);
    iVar3 = XMLString::indexOf(typeName,L',');
    iVar4 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,__n);
    this->fTypeName = (XMLCh *)CONCAT44(extraout_var,iVar4);
    memmove((XMLCh *)CONCAT44(extraout_var,iVar4),typeName,__n);
    if (iVar3 == -1) {
      this->fTypeUri = L"http://www.w3.org/2001/XMLSchema";
      this->fTypeLocalName = this->fTypeName;
    }
    else {
      this->fTypeUri = this->fTypeName;
      pXVar2 = this->fTypeName + iVar3;
      this->fTypeLocalName = pXVar2 + 1;
      *pXVar2 = L'\0';
    }
  }
  return;
}

Assistant:

void DatatypeValidator::setTypeName(const XMLCh* const typeName)
{
    if (fTypeName)
    {
        fMemoryManager->deallocate(fTypeName);
        fTypeName = 0;
    }

    if (typeName)
    {
        XMLSize_t nameLen = XMLString::stringLen(typeName);
        int commaOffset = XMLString::indexOf(typeName, chComma);

        fTypeName = (XMLCh*) fMemoryManager->allocate
        (
            (nameLen + 1) * sizeof(XMLCh)
        );
	    XMLString::moveChars(fTypeName, typeName, nameLen+1);

        if ( commaOffset == -1) {
            fTypeUri = SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
            fTypeLocalName = fTypeName;
        }
        else {
            fTypeUri = fTypeName;
            fTypeLocalName = &fTypeName[commaOffset+1];
            fTypeName[commaOffset] = chNull;
        }
    }
    else
    {
        fTypeUri = fTypeLocalName = XMLUni::fgZeroLenString;
    }
}